

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O0

int IsRegister(char *zeexpression)

{
  int iVar1;
  char *zeexpression_local;
  
  iVar1 = GetCRC(zeexpression);
  if (iVar1 == -0x1e60ee9e) {
    iVar1 = strcmp(zeexpression,"IYH");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == -0x1e60ee9a) {
    iVar1 = strcmp(zeexpression,"IYL");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == -0x1e60e89f) {
    iVar1 = strcmp(zeexpression,"IXH");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == -0x1e60e89b) {
    iVar1 = strcmp(zeexpression,"IXL");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd50519) {
    iVar1 = strcmp(zeexpression,"YH");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd5051d) {
    iVar1 = strcmp(zeexpression,"YL");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd50718) {
    iVar1 = strcmp(zeexpression,"XH");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd5071c) {
    iVar1 = strcmp(zeexpression,"XL");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd52519) {
    iVar1 = strcmp(zeexpression,"IX");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd5251a) {
    iVar1 = strcmp(zeexpression,"IY");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd5270c) {
    iVar1 = strcmp(zeexpression,"HL");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd52718) {
    iVar1 = strcmp(zeexpression,"HX");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd52719) {
    iVar1 = strcmp(zeexpression,"HY");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd52f1c) {
    iVar1 = strcmp(zeexpression,"LX");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd52f1d) {
    iVar1 = strcmp(zeexpression,"LY");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd5311b) {
    iVar1 = strcmp(zeexpression,"SP");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd5d2fd) {
    iVar1 = strcmp(zeexpression,"BC");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd5d4ff) {
    iVar1 = strcmp(zeexpression,"AF");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x4bd5df01) {
    iVar1 = strcmp(zeexpression,"DE");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x7a98a6b9) {
    iVar1 = strcmp(zeexpression,"A");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x7a98a6ba) {
    iVar1 = strcmp(zeexpression,"B");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x7a98a6bb) {
    iVar1 = strcmp(zeexpression,"C");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x7a98a6bc) {
    iVar1 = strcmp(zeexpression,"D");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x7a98a6bd) {
    iVar1 = strcmp(zeexpression,"E");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x7a98a6be) {
    iVar1 = strcmp(zeexpression,"F");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x7a98a6c0) {
    iVar1 = strcmp(zeexpression,"H");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x7a98a6c1) {
    iVar1 = strcmp(zeexpression,"I");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x7a98a6c4) {
    iVar1 = strcmp(zeexpression,"L");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else if (iVar1 == 0x7a98a6ca) {
    iVar1 = strcmp(zeexpression,"R");
    if (iVar1 == 0) {
      zeexpression_local._4_4_ = 1;
    }
    else {
      zeexpression_local._4_4_ = 0;
    }
  }
  else {
    zeexpression_local._4_4_ = 0;
  }
  return zeexpression_local._4_4_;
}

Assistant:

int IsRegister(char *zeexpression)
{
	#undef FUNC
	#define FUNC "IsRegister"

	switch (GetCRC(zeexpression)) {
		case CRC_F:if (strcmp(zeexpression,"F")==0) return 1; else return 0;
		case CRC_I:if (strcmp(zeexpression,"I")==0) return 1; else return 0;
		case CRC_R:if (strcmp(zeexpression,"R")==0) return 1; else return 0;
		case CRC_A:if (strcmp(zeexpression,"A")==0) return 1; else return 0;
		case CRC_B:if (strcmp(zeexpression,"B")==0) return 1; else return 0;
		case CRC_C:if (strcmp(zeexpression,"C")==0) return 1; else return 0;
		case CRC_D:if (strcmp(zeexpression,"D")==0) return 1; else return 0;
		case CRC_E:if (strcmp(zeexpression,"E")==0) return 1; else return 0;
		case CRC_H:if (strcmp(zeexpression,"H")==0) return 1; else return 0;
		case CRC_L:if (strcmp(zeexpression,"L")==0) return 1; else return 0;
		case CRC_BC:if (strcmp(zeexpression,"BC")==0) return 1; else return 0;
		case CRC_DE:if (strcmp(zeexpression,"DE")==0) return 1; else return 0;
		case CRC_HL:if (strcmp(zeexpression,"HL")==0) return 1; else return 0;
		case CRC_IX:if (strcmp(zeexpression,"IX")==0) return 1; else return 0;
		case CRC_IY:if (strcmp(zeexpression,"IY")==0) return 1; else return 0;
		case CRC_SP:if (strcmp(zeexpression,"SP")==0) return 1; else return 0;
		case CRC_AF:if (strcmp(zeexpression,"AF")==0) return 1; else return 0;
		case CRC_XH:if (strcmp(zeexpression,"XH")==0) return 1; else return 0;
		case CRC_XL:if (strcmp(zeexpression,"XL")==0) return 1; else return 0;
		case CRC_YH:if (strcmp(zeexpression,"YH")==0) return 1; else return 0;
		case CRC_YL:if (strcmp(zeexpression,"YL")==0) return 1; else return 0;
		case CRC_HX:if (strcmp(zeexpression,"HX")==0) return 1; else return 0;
		case CRC_LX:if (strcmp(zeexpression,"LX")==0) return 1; else return 0;
		case CRC_HY:if (strcmp(zeexpression,"HY")==0) return 1; else return 0;
		case CRC_LY:if (strcmp(zeexpression,"LY")==0) return 1; else return 0;
		case CRC_IXL:if (strcmp(zeexpression,"IXL")==0) return 1; else return 0;
		case CRC_IXH:if (strcmp(zeexpression,"IXH")==0) return 1; else return 0;
		case CRC_IYL:if (strcmp(zeexpression,"IYL")==0) return 1; else return 0;
		case CRC_IYH:if (strcmp(zeexpression,"IYH")==0) return 1; else return 0;
		default:break;
	}
	return 0;
}